

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmap.h
# Opt level: O2

bool __thiscall
QMultiMap<QGraphicsItem_*,_QGraphicsItem_*>::contains
          (QMultiMap<QGraphicsItem_*,_QGraphicsItem_*> *this,QGraphicsItem **key)

{
  QMapData<std::multimap<QGraphicsItem_*,_QGraphicsItem_*,_std::less<QGraphicsItem_*>,_std::allocator<std::pair<QGraphicsItem_*const,_QGraphicsItem_*>_>_>_>
  *pQVar1;
  const_iterator cVar2;
  bool bVar3;
  
  pQVar1 = (this->d).d.ptr;
  if (pQVar1 == (QMapData<std::multimap<QGraphicsItem_*,_QGraphicsItem_*,_std::less<QGraphicsItem_*>,_std::allocator<std::pair<QGraphicsItem_*const,_QGraphicsItem_*>_>_>_>
                 *)0x0) {
    bVar3 = false;
  }
  else {
    cVar2 = std::
            _Rb_tree<QGraphicsItem_*,_std::pair<QGraphicsItem_*const,_QGraphicsItem_*>,_std::_Select1st<std::pair<QGraphicsItem_*const,_QGraphicsItem_*>_>,_std::less<QGraphicsItem_*>,_std::allocator<std::pair<QGraphicsItem_*const,_QGraphicsItem_*>_>_>
            ::find(&(pQVar1->m)._M_t,key);
    bVar3 = (_Rb_tree_header *)cVar2._M_node !=
            &(((this->d).d.ptr)->m)._M_t._M_impl.super__Rb_tree_header;
  }
  return bVar3;
}

Assistant:

bool contains(const Key &key) const
    {
        if (!d)
            return false;
        auto i = d->m.find(key);
        return i != d->m.end();
    }